

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

bool __thiscall
Minisat::Solver::implies(Solver *this,vec<Minisat::Lit,_int> *assumps,vec<Minisat::Lit,_int> *out)

{
  Lit p;
  int iVar1;
  CRef CVar2;
  byte bVar3;
  byte bVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  int local_34;
  
  vec<int,_int>::push(&this->trail_lim,&local_34);
  iVar1 = assumps->sz;
  if (0 < iVar1) {
    lVar6 = 0;
    bVar7 = false;
    do {
      p.x = assumps->data[lVar6].x;
      if ((this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.sz <=
          p.x >> 1) {
        __assert_fail("has(k)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                      ,0x27,
                      "const V &Minisat::IntMap<int, Minisat::lbool>::operator[](K) const [K = int, V = Minisat::lbool, MkIndex = Minisat::MkIndexDefault<int>]"
                     );
      }
      bVar3 = (this->assigns).super_IntMap<int,_Minisat::lbool,_Minisat::MkIndexDefault<int>_>.map.
              data[p.x >> 1].value;
      bVar4 = (byte)p.x & 1 ^ bVar3;
      bVar3 = bVar3 & 2;
      if (bVar4 == l_False && (l_False & 2) == 0 || (bVar3 & l_False) != 0) goto LAB_0010c6c4;
      if (bVar4 == l_Undef && (l_Undef & 2) == 0 || (bVar3 & l_Undef) != 0) {
        uncheckedEnqueue(this,p,0xffffffff);
        iVar1 = assumps->sz;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar1);
  }
  iVar1 = (this->trail).sz;
  lVar6 = (long)iVar1;
  CVar2 = propagate(this);
  bVar7 = CVar2 == 0xffffffff;
  if (bVar7) {
    if (out->data != (Lit *)0x0) {
      out->sz = 0;
    }
    if (iVar1 < (this->trail).sz) {
      lVar5 = lVar6 * 4;
      do {
        vec<Minisat::Lit,_int>::push(out,(Lit *)((long)&((this->trail).data)->x + lVar5));
        lVar6 = lVar6 + 1;
        lVar5 = lVar5 + 4;
      } while (lVar6 < (this->trail).sz);
    }
  }
LAB_0010c6c4:
  cancelUntil(this,0);
  return bVar7;
}

Assistant:

bool Solver::implies(const vec<Lit>& assumps, vec<Lit>& out)
{
    trail_lim.push(trail.size());
    for (int i = 0; i < assumps.size(); i++){
        Lit a = assumps[i];

        if (value(a) == l_False){
            cancelUntil(0);
            return false;
        }else if (value(a) == l_Undef)
            uncheckedEnqueue(a);
    }

    unsigned trail_before = trail.size();
    bool     ret          = true;
    if (propagate() == CRef_Undef){
        out.clear();
        for (int j = trail_before; j < trail.size(); j++)
            out.push(trail[j]);
    }else
        ret = false;
    
    cancelUntil(0);
    return ret;
}